

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datrie.c
# Opt level: O1

void datrie_match(datrie_dictionary_desc *datrie_dictionary,ucs4_t *word,size_t *match_pos,
                 size_t *id,size_t limit)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  ucs4_t uVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  ulong uVar8;
  bool bVar9;
  
  uVar4 = *word;
  if (uVar4 == 0) {
    uVar3 = 0;
    sVar7 = 0;
  }
  else {
    sVar6 = 0;
    sVar2 = 0;
    uVar8 = 1;
    do {
      iVar1 = datrie_dictionary->dat[sVar2].base;
      uVar3 = sVar2;
      sVar7 = sVar6;
      if (iVar1 == -1) break;
      uVar5 = iVar1 + uVar4;
      if (((int)uVar5 < 0) || (datrie_dictionary->dat_item_count <= uVar5)) {
        bVar9 = false;
      }
      else {
        bVar9 = sVar2 == (long)datrie_dictionary->dat[uVar5].parent;
        uVar3 = (ulong)uVar5;
        if (!bVar9) {
          uVar3 = sVar2;
        }
      }
      if (!bVar9) {
        sVar7 = uVar8 - 1;
        break;
      }
      sVar7 = uVar8;
      if (limit - 1 < uVar8) break;
      sVar6 = sVar6 + 1;
      uVar4 = word[uVar8];
      sVar2 = uVar3;
      uVar8 = uVar8 + 1;
    } while (uVar4 != 0);
  }
  if (match_pos != (size_t *)0x0) {
    *match_pos = sVar7;
  }
  if (id != (size_t *)0x0) {
    *id = uVar3;
  }
  return;
}

Assistant:

void datrie_match(const datrie_dictionary_desc * datrie_dictionary, const ucs4_t * word,
		size_t *match_pos, size_t *id, size_t limit)
{
	size_t i, p;
	for (i = 0,p = 0; word[p] && (limit == 0 || p < limit) &&
			datrie_dictionary->dat[i].base != DATRIE_UNUSED; p ++)
	{
		int k = encode_char(word[p]);
		int j = datrie_dictionary->dat[i].base + k;
		if (j < 0 || j >= datrie_dictionary->dat_item_count || datrie_dictionary->dat[j].parent != i)
			break;
		i = j;
	}
	if (match_pos)
		*match_pos = p;
	if (id)
		*id = i;
}